

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMPrintErrorHandler.cpp
# Opt level: O3

bool __thiscall DOMPrintErrorHandler::handleError(DOMPrintErrorHandler *this,DOMError *domError)

{
  int iVar1;
  wchar16 *pwVar2;
  size_t sVar3;
  long lVar4;
  char *pcVar5;
  char *msg;
  char *local_18;
  
  iVar1 = (**(code **)(*(long *)domError + 0x10))(domError);
  if (iVar1 == 1) {
    pcVar5 = "\nWarning Message: ";
    lVar4 = 0x12;
  }
  else {
    iVar1 = (**(code **)(*(long *)domError + 0x10))(domError);
    if (iVar1 == 2) {
      pcVar5 = "\nError Message: ";
    }
    else {
      pcVar5 = "\nFatal Message: ";
    }
    lVar4 = 0x10;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar5,lVar4);
  pwVar2 = (wchar16 *)(**(code **)(*(long *)domError + 0x18))(domError);
  pcVar5 = (char *)xercesc_4_0::XMLString::transcode
                             (pwVar2,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_18 = pcVar5;
  if (pcVar5 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1091c0);
  }
  else {
    sVar3 = strlen(pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar5,sVar3);
  }
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  xercesc_4_0::XMLString::release(&local_18,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  return true;
}

Assistant:

bool DOMPrintErrorHandler::handleError(const DOMError &domError)
{
    // Display whatever error message passed from the serializer
    if (domError.getSeverity() == DOMError::DOM_SEVERITY_WARNING)
        std::cerr << "\nWarning Message: ";
    else if (domError.getSeverity() == DOMError::DOM_SEVERITY_ERROR)
        std::cerr << "\nError Message: ";
    else
        std::cerr << "\nFatal Message: ";

    char *msg = XMLString::transcode(domError.getMessage());
    std::cerr<< msg <<std::endl;
    XMLString::release(&msg);

    // Instructs the serializer to continue serialization if possible.
    return true;
}